

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::vec<16U,_float>_> *this_00;
  hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
  *this_01;
  vec<16U,_float> *lhs;
  VectorInfo *pVVar1;
  bool bVar2;
  double dVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  vq_node *pvVar6;
  undefined7 in_register_00000089;
  uint task;
  long lVar7;
  ulong uVar8;
  void *pData_ptr;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  uint end_node;
  double local_1c8;
  tree_clusterizer<crnlib::vec<16U,_float>_> *local_1c0;
  uint local_1b4;
  ulong local_1b0;
  undefined4 local_1a8;
  float local_1a4;
  node_vec_type *local_1a0;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
  params;
  vq_node root;
  insert_result local_48;
  
  local_1a8 = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfo,size,false);
  this_00 = &this->m_weightedVectors;
  vector<crnlib::vec<16U,_float>_>::resize(this_00,size,false);
  vector<double>::resize(&this->m_weightedDotProducts,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoLeft,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoRight,size,false);
  vector<bool>::resize(&this->m_vectorComparison,size,false);
  local_1a0 = &this->m_nodes;
  local_1b0 = (ulong)max_splits;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::resize
            (local_1a0,max_splits * 4,false);
  local_1c0 = this;
  vector<crnlib::vec<16U,_float>_>::clear(&this->m_codebook);
  if (pTask_pool == (task_pool *)0x0) {
    local_1b4 = 1;
  }
  else {
    local_1b4 = pTask_pool->m_num_threads + 1;
  }
  root.m_centroid.m_s[0xc] = 0.0;
  root.m_centroid.m_s[0xd] = 0.0;
  root.m_centroid.m_s[0xe] = 0.0;
  root.m_centroid.m_s[0xf] = 0.0;
  root.m_centroid.m_s[8] = 0.0;
  root.m_centroid.m_s[9] = 0.0;
  root.m_centroid.m_s[10] = 0.0;
  root.m_centroid.m_s[0xb] = 0.0;
  root.m_centroid.m_s[4] = 0.0;
  root.m_centroid.m_s[5] = 0.0;
  root.m_centroid.m_s[6] = 0.0;
  root.m_centroid.m_s[7] = 0.0;
  root.m_total_weight = 0;
  root.m_centroid.m_s[0] = 0.0;
  root.m_centroid.m_s[1] = 0.0;
  root.m_centroid.m_s[2] = 0.0;
  root.m_centroid.m_s[3] = 0.0;
  root.m_left = -1;
  root.m_right = -1;
  root.m_codebook_index = -1;
  root.m_unsplittable = false;
  root.m_alternative = false;
  root.m_processed = false;
  root.m_begin = 0;
  local_1c8 = 0.0;
  lVar7 = 0;
  root.m_end = size;
  for (uVar4 = 0; uVar4 < (local_1c0->m_vectorsInfo).m_size; uVar4 = uVar4 + 1) {
    lhs = (vec<16U,_float> *)((long)vectors->m_s + lVar7);
    pVVar1 = (this->m_vectorsInfo).m_p;
    pVVar1[uVar4].index = (uint)uVar4;
    uVar10 = weights[uVar4];
    pVVar1[uVar4].weight = uVar10;
    local_1a4 = (float)uVar10;
    operator*(lhs,local_1a4);
    vec<16U,_float>::operator=
              ((vec<16U,_float> *)((long)this_00->m_p->m_s + lVar7),
               (vec<16U,_float> *)&alternative_node_queue);
    vec<16U,_float>::operator+=
              (&root.m_centroid,(vec<16U,_float> *)((long)this_00->m_p->m_s + lVar7));
    root.m_total_weight = root.m_total_weight + uVar10;
    fVar12 = operator*(lhs,lhs);
    (this->m_weightedDotProducts).m_p[uVar4] = (double)(fVar12 * local_1a4);
    local_1c8 = local_1c8 + (double)(fVar12 * local_1a4);
    lVar7 = lVar7 + 0x40;
  }
  fVar12 = operator*(&root.m_centroid,&root.m_centroid);
  uVar4 = local_1b0;
  uVar10 = (uint)local_1b0;
  root.m_variance = (float)(local_1c8 - (double)(fVar12 / (float)root.m_total_weight));
  vec<16U,_float>::operator*=(&root.m_centroid,1.0 / (float)root.m_total_weight);
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  end_node = 0;
  vq_node::operator=(local_1a0->m_p,&root);
  alternative_node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = end_node;
  alternative_node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = root.m_variance;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::push(&node_queue,(value_type *)&alternative_node_queue);
  end_node = end_node + 1;
  if (local_1b4 < 2) {
    uVar5 = 1;
  }
  else {
    local_1c8 = (double)CONCAT44(local_1c8._4_4_,uVar10 + (uVar10 == 0));
    uVar8 = (ulong)local_1b4;
    for (uVar5 = 1; uVar5 < uVar10; uVar5 = uVar5 + 1) {
      if (((long)node_queue.c.
                 super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)node_queue.c.
                 super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar8) ||
         (bVar2 = split_node(local_1c0,&node_queue,&end_node,pTask_pool), !bVar2))
      goto LAB_00165c83;
    }
    uVar5 = local_1c8._0_4_;
LAB_00165c83:
    if ((long)node_queue.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)node_queue.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar8) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::vector(&alternative_node_queue.c,&node_queue.c);
      pData_ptr = (void *)0x0;
      uVar8 = (ulong)local_1b4;
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
      ::vector(&params,local_1b4);
      uVar9 = uVar10 * 2;
      uVar11 = (uint)((uVar4 & 0xffffffff) / uVar8);
      while ((pointer)CONCAT44(alternative_node_queue.c.
                               super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)alternative_node_queue.c.
                                     super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start) !=
             alternative_node_queue.c.
             super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        params.m_p[(long)pData_ptr].main_node =
             ((pointer)
             CONCAT44(alternative_node_queue.c.
                      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)alternative_node_queue.c.
                            super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start))->m_index;
        params.m_p[(long)pData_ptr].alternative_node = uVar9;
        params.m_p[(long)pData_ptr].max_splits = uVar11;
        task_pool::
        queue_object_task<crnlib::tree_clusterizer<crnlib::vec<16u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*)>
                  (pTask_pool,local_1c0,0x16c65c,0,pData_ptr);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::pop(&alternative_node_queue);
        uVar9 = uVar9 + uVar11 * 2;
        pData_ptr = (void *)(ulong)((int)pData_ptr + 1);
      }
      task_pool::join(pTask_pool);
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
      ::~vector(&params);
      std::
      _Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                       *)&alternative_node_queue);
      uVar10 = (uint)local_1b0;
    }
  }
  uVar5 = uVar5 - 1;
  do {
    uVar5 = uVar5 + 1;
    if (uVar10 <= uVar5) break;
    bVar2 = split_node(local_1c0,&node_queue,&end_node,pTask_pool);
  } while (bVar2);
  this_01 = &local_1c0->m_node_index_map;
  dVar3 = 0.0;
  while ((ulong)dVar3 < (ulong)end_node) {
    pvVar6 = local_1a0->m_p;
    local_1c8 = dVar3;
    if ((pvVar6[(long)dVar3].m_alternative != false) || (pvVar6[(long)dVar3].m_left == -1)) {
      pvVar6 = pvVar6 + (long)dVar3;
      pvVar6->m_codebook_index = (local_1c0->m_codebook).m_size;
      vector<crnlib::vec<16U,_float>_>::push_back(&this->m_codebook,&pvVar6->m_centroid);
      if ((char)local_1a8 != '\0') {
        for (uVar4 = (ulong)pvVar6->m_begin; uVar4 < pvVar6->m_end; uVar4 = uVar4 + 1) {
          std::pair<crnlib::vec<16U,_float>,_int>::pair<crnlib::vec<16U,_float>_&,_int_&,_true>
                    ((pair<crnlib::vec<16U,_float>,_int> *)&params,
                     local_1c0->m_vectors + (local_1c0->m_vectorsInfo).m_p[uVar4].index,
                     &pvVar6->m_codebook_index);
          std::pair<crnlib::vec<16U,_float>,_unsigned_int>::pair<crnlib::vec<16U,_float>,_int,_true>
                    ((pair<crnlib::vec<16U,_float>,_unsigned_int> *)&alternative_node_queue,
                     (pair<crnlib::vec<16U,_float>,_int> *)&params);
          hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
          ::insert(&local_48,this_01,
                   (pair<crnlib::vec<16U,_float>,_unsigned_int> *)&alternative_node_queue);
        }
      }
    }
    dVar3 = (double)((long)local_1c8 + 1);
  }
  std::
  _Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                   *)&node_queue);
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }